

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

bool google::protobuf::anon_unknown_26::IsSubSymbol(string_view sub_symbol,string_view super_symbol)

{
  string_view prefix;
  string_view text;
  bool bVar1;
  size_type __pos;
  const_reference pvVar2;
  bool local_6a;
  bool local_69;
  undefined1 local_28 [8];
  string_view super_symbol_local;
  string_view sub_symbol_local;
  
  super_symbol_local._M_str = (char *)sub_symbol._M_len;
  super_symbol_local._M_len = (size_t)super_symbol._M_str;
  local_28 = (undefined1  [8])super_symbol._M_len;
  bVar1 = std::operator==(sub_symbol,super_symbol);
  local_69 = true;
  if (!bVar1) {
    text._M_str = (char *)super_symbol_local._M_len;
    text._M_len = (size_t)local_28;
    prefix._M_str = sub_symbol._M_str;
    prefix._M_len = (size_t)super_symbol_local._M_str;
    bVar1 = absl::lts_20240722::StartsWith(text,prefix);
    local_6a = false;
    if (bVar1) {
      __pos = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         &super_symbol_local._M_str);
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_28,__pos);
      local_6a = *pvVar2 == '.';
    }
    local_69 = local_6a;
  }
  return local_69;
}

Assistant:

bool IsSubSymbol(absl::string_view sub_symbol, absl::string_view super_symbol) {
  return sub_symbol == super_symbol ||
         (absl::StartsWith(super_symbol, sub_symbol) &&
          super_symbol[sub_symbol.size()] == '.');
}